

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  GLfloat GVar2;
  float fVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar12;
  GLFWwindow *pGVar13;
  Vertex *pVVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int local_1b80;
  int local_1b7c;
  timespec local_1b78;
  GLFWwindow *local_1b68;
  thrd_t physics_thread;
  double local_1b58;
  long local_1b50;
  GLfloat mat [16];
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  float local_1ab8;
  undefined8 local_1ab4;
  undefined8 uStack_1aac;
  undefined4 local_1aa4;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 local_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  Vertex vertex_array [280];
  
  physics_thread = 0;
  iVar11 = glfwInit();
  if (iVar11 == 0) {
    fwrite("Failed to initialize GLFW\n",0x1a,1,_stderr);
  }
  else {
    handle = (GLFWmonitor *)0x0;
    while( true ) {
      while (iVar11 = getopt(argc,argv,"fh"), iVar11 == 0x66) {
        handle = glfwGetPrimaryMonitor();
      }
      if (iVar11 == -1) break;
      if (iVar11 == 0x68) {
        usage();
LAB_00115c5b:
        exit(0);
      }
    }
    if (handle == (GLFWmonitor *)0x0) {
      local_1b80 = 0x1e0;
      local_1b7c = 0x280;
    }
    else {
      pGVar12 = glfwGetVideoMode(handle);
      glfwWindowHint(0x21001,pGVar12->redBits);
      glfwWindowHint(0x21002,pGVar12->greenBits);
      glfwWindowHint(0x21003,pGVar12->blueBits);
      glfwWindowHint(0x2100f,pGVar12->refreshRate);
      local_1b7c = pGVar12->width;
      local_1b80 = pGVar12->height;
    }
    pGVar13 = glfwCreateWindow(local_1b7c,local_1b80,"Particle Engine",handle,(GLFWwindow *)0x0);
    if (pGVar13 == (GLFWwindow *)0x0) {
      fwrite("Failed to create GLFW window\n",0x1d,1,_stderr);
    }
    else {
      if (handle != (GLFWmonitor *)0x0) {
        glfwSetInputMode(pGVar13,0x33001,0x34003);
      }
      glfwMakeContextCurrent(pGVar13);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(1);
      glfwSetFramebufferSizeCallback(pGVar13,resize_callback);
      glfwSetKeyCallback(pGVar13,key_callback);
      local_1b68 = pGVar13;
      glfwGetFramebufferSize(pGVar13,&local_1b7c,&local_1b80);
      iVar16 = local_1b7c;
      iVar11 = local_1b80;
      (*glad_glViewport)(0,0,local_1b7c,local_1b80);
      if (iVar11 == 0) {
        aspect_ratio = 1.0;
      }
      else {
        aspect_ratio = (float)iVar16 / (float)iVar11;
      }
      (*glad_glGenTextures)(1,&particle_tex_id);
      (*glad_glBindTexture)(0xde1,particle_tex_id);
      (*glad_glPixelStorei)(0xcf5,1);
      (*glad_glTexParameteri)(0xde1,0x2802,0x2900);
      (*glad_glTexParameteri)(0xde1,0x2803,0x2900);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexImage2D)(0xde1,0,0x1909,8,8,0,0x1909,0x1401,"");
      (*glad_glGenTextures)(1,&floor_tex_id);
      (*glad_glBindTexture)(0xde1,floor_tex_id);
      (*glad_glPixelStorei)(0xcf5,1);
      (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
      (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexImage2D)(0xde1,0,0x1909,0x10,0x10,0,0x1909,0x1401,floor_texture);
      iVar11 = glfwExtensionSupported("GL_EXT_separate_specular_color");
      if (iVar11 != 0) {
        (*glad_glLightModeli)(0x81f8,0x81fa);
      }
      (*glad_glPolygonMode)(0x408,0x1b02);
      wireframe = 0;
      thread_sync.t = 0.0;
      thread_sync.dt = 0.001;
      thread_sync.p_frame = 0;
      thread_sync.d_frame = 0;
      mtx_init(&thread_sync.particles_lock,2);
      cnd_init(&thread_sync.p_done);
      cnd_init(&thread_sync.d_done);
      pGVar13 = local_1b68;
      iVar11 = thrd_create(&physics_thread,physics_thread_main,local_1b68);
      if (iVar11 == 1) {
        glfwSetTime(0.0);
        iVar11 = glfwWindowShouldClose(pGVar13);
        while (iVar11 == 0) {
          dVar5 = glfwGetTime();
          local_1b58 = dVar5 - draw_scene_t_old;
          local_1ab8 = 1.5696855 / aspect_ratio;
          local_1ab4 = 0;
          uStack_1aac = 0;
          local_1aa4 = 0x3fc8eb74;
          local_1aa0 = 0;
          uStack_1a98 = 0;
          local_1a90 = 0xbf800000bf8456c8;
          uStack_1a88 = 0;
          local_1a80 = 0xc0022b64;
          draw_scene_t_old = dVar5;
          (*glad_glClearColor)(0.1,0.1,0.1,1.0);
          (*glad_glClear)(0x4100);
          (*glad_glMatrixMode)(0x1701);
          (*glad_glLoadMatrixf)(&local_1ab8);
          (*glad_glMatrixMode)(0x1700);
          (*glad_glLoadIdentity)();
          dVar6 = sin(dVar5 * 0.3);
          (*glad_glRotated)(-80.0,1.0,0.0,0.0);
          (*glad_glRotated)(dVar6 * -10.0,0.0,1.0,0.0);
          (*glad_glRotated)(-(dVar5 * 10.0),0.0,0.0,1.0);
          dVar6 = dVar5 * 10.0 * 0.017453292519943295;
          dVar7 = sin(dVar6);
          dVar8 = sin(dVar5 * 0.054105206811824215);
          dVar6 = cos(dVar6);
          dVar9 = cos(dVar5 * 0.05061454830783556);
          dVar10 = cos(dVar5 * 0.08552113334772216);
          (*glad_glTranslated)
                    (-(dVar8 + dVar8 + dVar7 * 15.0),-(dVar6 * -15.0 + dVar9 + dVar9),
                     -(dVar10 + dVar10 + 4.0));
          (*glad_glFrontFace)(0x901);
          (*glad_glCullFace)(0x405);
          (*glad_glEnable)(0xb44);
          vertex_array[0].s = 0.0;
          vertex_array[0].t = -9.0;
          vertex_array[0].rgba = 0x41000000;
          vertex_array[0].x = 1.0;
          mat[0] = 0.2;
          mat[1] = 0.2;
          mat[2] = 0.2;
          mat[3] = 1.0;
          local_1b78.tv_sec = 0x3ecccccd3f4ccccd;
          local_1b78.tv_nsec = 0x3f8000003e4ccccd;
          local_1ac8 = 0x3f19999a3f800000;
          uStack_1ac0 = 0x3e4ccccd;
          local_1ad8 = 0x41400000c1700000;
          uStack_1ad0 = 0x3f8000003fc00000;
          local_1ae8 = 0;
          uStack_1ae0 = 0x3f80000000000000;
          local_1af8 = 0x3ecccccd3e4ccccd;
          uStack_1af0 = 0x3f8000003f4ccccd;
          local_1b08 = 0x3f19999a3e4ccccd;
          uStack_1b00 = 0x3f800000;
          (*glad_glLightfv)(0x4001,0x1203,&vertex_array[0].s);
          (*glad_glLightfv)(0x4001,0x1200,mat);
          (*glad_glLightfv)(0x4001,0x1201,(GLfloat *)&local_1b78);
          (*glad_glLightfv)(0x4001,0x1202,(GLfloat *)&local_1ac8);
          (*glad_glLightfv)(0x4002,0x1203,(GLfloat *)&local_1ad8);
          (*glad_glLightfv)(0x4002,0x1200,(GLfloat *)&local_1ae8);
          (*glad_glLightfv)(0x4002,0x1201,(GLfloat *)&local_1af8);
          (*glad_glLightfv)(0x4002,0x1202,(GLfloat *)&local_1b08);
          (*glad_glLightfv)(0x4003,0x1203,glow_pos);
          (*glad_glLightfv)(0x4003,0x1201,glow_color);
          (*glad_glLightfv)(0x4003,0x1202,glow_color);
          (*glad_glEnable)(0x4001);
          (*glad_glEnable)(0x4002);
          (*glad_glEnable)(0x4003);
          (*glad_glEnable)(0xb50);
          (*glad_glEnable)(0xb60);
          (*glad_glFogi)(0xb65,0x800);
          (*glad_glFogf)(0xb62,0.05);
          (*glad_glFogfv)(0xb66,fog_color);
          if (wireframe == 0) {
            (*glad_glEnable)(0xde1);
            (*glad_glBindTexture)(0xde1,floor_tex_id);
          }
          if (draw_floor_floor_list == 0) {
            draw_floor_floor_list = (*glad_glGenLists)(1);
            (*glad_glNewList)(draw_floor_floor_list,0x1301);
            (*glad_glMaterialfv)(0x404,0x1201,floor_diffuse);
            (*glad_glMaterialfv)(0x404,0x1202,floor_specular);
            (*glad_glMaterialf)(0x404,0x1601,18.0);
            (*glad_glNormal3f)(0.0,0.0,1.0);
            (*glad_glBegin)(7);
            tessellate_floor(-1.0,-1.0,0.0,0.0,0);
            tessellate_floor(0.0,-1.0,1.0,0.0,0);
            tessellate_floor(0.0,0.0,1.0,1.0,0);
            tessellate_floor(-1.0,0.0,0.0,1.0,0);
            (*glad_glEnd)();
            (*glad_glEndList)();
          }
          else {
            (*glad_glCallList)(draw_floor_floor_list);
          }
          (*glad_glDisable)(0xde1);
          (*glad_glEnable)(0xb71);
          (*glad_glDepthFunc)(0x203);
          (*glad_glDepthMask)('\x01');
          if (draw_fountain_fountain_list == 0) {
            draw_fountain_fountain_list = (*glad_glGenLists)(1);
            (*glad_glNewList)(draw_fountain_fountain_list,0x1301);
            (*glad_glMaterialfv)(0x404,0x1201,fountain_diffuse);
            (*glad_glMaterialfv)(0x404,0x1202,fountain_specular);
            (*glad_glMaterialf)(0x404,0x1601,12.0);
            lVar17 = 0;
            do {
              (*glad_glBegin)(5);
              fVar21 = fountain_normal[lVar17 * 2 + 2];
              GVar2 = fountain_normal[lVar17 * 2 + 3];
              lVar1 = lVar17 * 2 + 1;
              dVar6 = 0.0;
              iVar11 = 0x21;
              local_1b50 = lVar17;
              do {
                dVar7 = cos(dVar6 * 0.19634954084936207);
                fVar24 = (float)dVar7;
                dVar7 = sin(dVar6 * 0.19634954084936207);
                fVar25 = (float)dVar7;
                (*glad_glNormal3f)(fVar21 * fVar24,fVar21 * fVar25,GVar2);
                fVar23 = fountain_side[lVar17 * 2];
                (*glad_glVertex3f)(fountain_side[lVar17 * 2 + 2] * fVar24,
                                   fountain_side[lVar17 * 2 + 2] * fVar25,
                                   fountain_side[lVar17 * 2 + 3]);
                (*glad_glNormal3f)(fountain_normal[lVar17 * 2] * fVar24,
                                   fountain_normal[lVar17 * 2] * fVar25,fountain_normal[lVar1]);
                (*glad_glVertex3f)(fVar24 * fVar23,fVar23 * fVar25,fountain_side[lVar1]);
                dVar6 = dVar6 + 1.0;
                iVar11 = iVar11 + -1;
              } while (iVar11 != 0);
              (*glad_glEnd)();
              lVar17 = local_1b50 + 1;
            } while (lVar17 != 0xd);
            (*glad_glEndList)();
            pGVar13 = local_1b68;
          }
          else {
            (*glad_glCallList)(draw_fountain_fountain_list);
          }
          (*glad_glDisable)(0xb50);
          (*glad_glDisable)(0xb60);
          (*glad_glGetFloatv)(0xba6,mat);
          fVar21 = (mat[0] + mat[1]) * -0.35;
          fVar23 = (mat[4] + mat[5]) * -0.35;
          fVar27 = (mat[8] + mat[9]) * -0.35;
          fVar24 = (mat[0] - mat[1]) * 0.35;
          fVar25 = (mat[4] - mat[5]) * 0.35;
          fVar26 = (mat[8] - mat[9]) * 0.35;
          (*glad_glDepthMask)('\0');
          (*glad_glEnable)(0xbe2);
          (*glad_glBlendFunc)(0x302,1);
          if (wireframe == 0) {
            (*glad_glEnable)(0xde1);
            (*glad_glBindTexture)(0xde1,particle_tex_id);
          }
          (*glad_glInterleavedArrays)(0x2a29,0,vertex_array);
          mtx_lock(&thread_sync.particles_lock);
          iVar11 = glfwWindowShouldClose(pGVar13);
          if (iVar11 == 0) {
            if (thread_sync.p_frame <= thread_sync.d_frame) {
              do {
                clock_gettime(0,&local_1b78);
                lVar17 = (local_1b78.tv_nsec + 100000000) / 1000000000;
                local_1b78.tv_sec = local_1b78.tv_sec + lVar17;
                local_1b78.tv_nsec = lVar17 * -1000000000 + local_1b78.tv_nsec + 100000000;
                cnd_timedwait(&thread_sync.p_done,&thread_sync.particles_lock,
                              (timespec *)&local_1b78);
                iVar11 = glfwWindowShouldClose(pGVar13);
                if (iVar11 != 0) break;
              } while (thread_sync.p_frame <= thread_sync.d_frame);
            }
          }
          thread_sync.dt = (float)local_1b58;
          thread_sync.d_frame = thread_sync.d_frame + 1;
          iVar11 = 0;
          lVar17 = 0x28;
          pVVar14 = vertex_array;
          thread_sync.t = dVar5;
          do {
            if (*(int *)((long)&particles[0].x + lVar17) != 0) {
              fVar18 = *(float *)(lVar17 + 0x15637c) * 4.0;
              fVar3 = *(float *)((long)&aspect_ratio + lVar17);
              fVar19 = *(float *)(lVar17 + 0x156374);
              fVar20 = *(float *)(lVar17 + 0x156378);
              fVar22 = 1.0;
              if (fVar18 <= 1.0) {
                fVar22 = fVar18;
              }
              pVVar14->s = 0.0;
              pVVar14->t = 0.0;
              uVar15 = (int)(fVar3 * 255.0) & 0xffU |
                       ((int)(fVar19 * 255.0) & 0xffU) << 8 |
                       ((int)(fVar20 * 255.0) & 0xffU) << 0x10 | (int)(fVar22 * 255.0) << 0x18;
              pVVar14->rgba = uVar15;
              uVar4 = *(undefined8 *)((long)&thread_sync.particles_lock + lVar17 + 0x10);
              fVar19 = (float)uVar4;
              fVar20 = (float)((ulong)uVar4 >> 0x20);
              pVVar14->x = fVar21 + fVar19;
              pVVar14->y = fVar23 + fVar20;
              fVar3 = *(float *)((long)&thread_sync.particles_lock + lVar17 + 0x18);
              pVVar14->z = fVar27 + fVar3;
              pVVar14[1].s = 1.0;
              pVVar14[1].t = 0.0;
              pVVar14[1].rgba = uVar15;
              pVVar14[1].x = fVar24 + fVar19;
              pVVar14[1].y = fVar25 + fVar20;
              pVVar14[1].z = fVar26 + fVar3;
              pVVar14[2].s = 1.0;
              pVVar14[2].t = 1.0;
              pVVar14[2].rgba = uVar15;
              pVVar14[2].x = fVar19 - fVar21;
              pVVar14[2].y = fVar20 - fVar23;
              pVVar14[2].z = fVar3 - fVar27;
              pVVar14[3].s = 0.0;
              pVVar14[3].t = 1.0;
              pVVar14[3].rgba = uVar15;
              pVVar14[3].x = fVar19 - fVar24;
              pVVar14[3].y = fVar20 - fVar25;
              pVVar14[3].z = fVar3 - fVar26;
              iVar16 = iVar11 + 1;
              if (iVar11 < 0x45) {
                pVVar14 = pVVar14 + 4;
                iVar11 = iVar16;
              }
              else {
                iVar11 = 0;
                (*glad_glDrawArrays)(7,0,iVar16 * 4);
                pVVar14 = vertex_array;
              }
            }
            lVar17 = lVar17 + 0x2c;
          } while ((int)lVar17 != 0x203c8);
          mtx_unlock(&thread_sync.particles_lock);
          cnd_signal(&thread_sync.d_done);
          (*glad_glDrawArrays)(7,0,iVar11 << 2);
          (*glad_glDisableClientState)(0x8074);
          (*glad_glDisableClientState)(0x8078);
          (*glad_glDisableClientState)(0x8076);
          (*glad_glDisable)(0xde1);
          (*glad_glDisable)(0xbe2);
          (*glad_glDepthMask)('\x01');
          (*glad_glDisable)(0xb71);
          glfwSwapBuffers(pGVar13);
          glfwPollEvents();
          iVar11 = glfwWindowShouldClose(pGVar13);
        }
        thrd_join(physics_thread,(int *)0x0);
        glfwDestroyWindow(pGVar13);
        glfwTerminate();
        goto LAB_00115c5b;
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    thrd_t physics_thread = 0;
    GLFWwindow* window;
    GLFWmonitor* monitor = NULL;

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        width  = mode->width;
        height = mode->height;
    }
    else
    {
        width  = 640;
        height = 480;
    }

    window = glfwCreateWindow(width, height, "Particle Engine", monitor, NULL);
    if (!window)
    {
        fprintf(stderr, "Failed to create GLFW window\n");
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    if (monitor)
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glfwSetFramebufferSizeCallback(window, resize_callback);
    glfwSetKeyCallback(window, key_callback);

    // Set initial aspect ratio
    glfwGetFramebufferSize(window, &width, &height);
    resize_callback(window, width, height);

    // Upload particle texture
    glGenTextures(1, &particle_tex_id);
    glBindTexture(GL_TEXTURE_2D, particle_tex_id);
    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, P_TEX_WIDTH, P_TEX_HEIGHT,
                 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, particle_texture);

    // Upload floor texture
    glGenTextures(1, &floor_tex_id);
    glBindTexture(GL_TEXTURE_2D, floor_tex_id);
    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, F_TEX_WIDTH, F_TEX_HEIGHT,
                 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, floor_texture);

    if (glfwExtensionSupported("GL_EXT_separate_specular_color"))
    {
        glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL_EXT,
                      GL_SEPARATE_SPECULAR_COLOR_EXT);
    }

    // Set filled polygon mode as default (not wireframe)
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    wireframe = 0;

    // Set initial times
    thread_sync.t  = 0.0;
    thread_sync.dt = 0.001f;
    thread_sync.p_frame = 0;
    thread_sync.d_frame = 0;

    mtx_init(&thread_sync.particles_lock, mtx_timed);
    cnd_init(&thread_sync.p_done);
    cnd_init(&thread_sync.d_done);

    if (thrd_create(&physics_thread, physics_thread_main, window) != thrd_success)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetTime(0.0);

    while (!glfwWindowShouldClose(window))
    {
        draw_scene(window, glfwGetTime());

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    thrd_join(physics_thread, NULL);

    glfwDestroyWindow(window);
    glfwTerminate();

    exit(EXIT_SUCCESS);
}